

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

string * genId_abi_cxx11_(void)

{
  __pid_t __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type in_stack_ffffffffffffffa8;
  string local_50;
  string newid;
  
  gmlc::utilities::randomString_abi_cxx11_(in_stack_ffffffffffffffa8);
  *newid._M_dataplus._M_p = '-';
  newid._M_dataplus._M_p[6] = '-';
  newid._M_dataplus._M_p[0xc] = '-';
  newid._M_dataplus._M_p[0x12] = '-';
  __val = getpid();
  CLI::std::__cxx11::to_string(&local_50,__val);
  std::operator+(in_RDI,&local_50,&newid);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&newid);
  return in_RDI;
}

Assistant:

static inline std::string genId()
{
    std::string newid = gmlc::utilities::randomString(24);

    newid[0] = '-';
    newid[6] = '-';
    newid[12] = '-';
    newid[18] = '-';

#ifdef _WIN32
    std::string pid_str = std::to_string(GetCurrentProcessId()) + newid;
#else
    std::string pid_str = std::to_string(getpid()) + newid;
#endif
    return pid_str;
}